

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O2

void __thiscall
TCLAP::StdOutput::spacePrint
          (StdOutput *this,ostream *os,string *s,int maxWidth,int indentSpaces,int secondLineOffset)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  bool bVar14;
  string local_50 [32];
  
  iVar10 = (int)s->_M_string_length;
  if (maxWidth < 1 || iVar10 + indentSpaces <= maxWidth) {
    iVar10 = 0;
    if (0 < indentSpaces) {
      iVar10 = indentSpaces;
    }
    while (iVar10 != 0) {
      std::operator<<(os," ");
      iVar10 = iVar10 + -1;
    }
    poVar6 = std::operator<<(os,(string *)s);
    std::endl<char,std::char_traits<char>>(poVar6);
    return;
  }
  uVar7 = maxWidth - indentSpaces;
  iVar12 = 0;
  do {
    uVar3 = iVar10 - iVar12;
    if (uVar3 == 0 || iVar10 < iVar12) {
      return;
    }
    uVar2 = uVar3;
    if ((int)uVar7 < (int)uVar3) {
      uVar2 = uVar7;
    }
    uVar5 = (ulong)uVar2;
    if (((int)uVar3 < (int)uVar7) || ((int)uVar2 < 0)) {
LAB_0012c1ae:
      if ((int)uVar5 < 1) goto LAB_0012c1b2;
    }
    else {
      lVar13 = (long)(int)uVar7 + 1;
      uVar3 = uVar7;
      do {
        uVar5 = (ulong)uVar3;
        cVar1 = (s->_M_dataplus)._M_p[lVar13 + (long)iVar12 + -1];
        if (((cVar1 == ' ') || (cVar1 == ',')) || (cVar1 == '|')) goto LAB_0012c1ae;
        uVar3 = uVar3 - 1;
        lVar11 = lVar13 + -1;
        bVar14 = 0 < lVar13;
        lVar13 = lVar11;
      } while (lVar11 != 0 && bVar14);
LAB_0012c1b2:
      uVar5 = (ulong)uVar7;
    }
    lVar13 = (long)iVar12;
    uVar8 = 0;
    while( true ) {
      iVar4 = (int)uVar5;
      if ((long)iVar4 <= (long)uVar8) break;
      lVar11 = uVar8 + lVar13;
      uVar8 = uVar8 + 1;
      if ((s->_M_dataplus)._M_p[lVar11] == '\n') {
        uVar5 = uVar8 & 0xffffffff;
      }
    }
    iVar9 = 0;
    if (0 < indentSpaces) {
      iVar9 = indentSpaces;
    }
    while (bVar14 = iVar9 != 0, iVar9 = iVar9 + -1, bVar14) {
      std::operator<<(os," ");
    }
    iVar9 = 0;
    if (iVar12 == 0) {
      iVar9 = secondLineOffset;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)s);
    poVar6 = std::operator<<(os,local_50);
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar7 = uVar7 - iVar9;
    indentSpaces = indentSpaces + iVar9;
    std::__cxx11::string::~string(local_50);
    iVar12 = iVar12 + iVar4 + -1;
    do {
      lVar11 = lVar13 + iVar4;
      iVar12 = iVar12 + 1;
      if (iVar10 <= lVar13) break;
      lVar13 = lVar13 + 1;
    } while ((s->_M_dataplus)._M_p[lVar11] == ' ');
  } while( true );
}

Assistant:

inline void StdOutput::spacePrint( std::ostream& os, 
						           const std::string& s, 
						           int maxWidth, 
						           int indentSpaces, 
						           int secondLineOffset ) const
{
	int len = static_cast<int>(s.length());

	if ( (len + indentSpaces > maxWidth) && maxWidth > 0 )
		{
			int allowedLen = maxWidth - indentSpaces;
			int start = 0;
			while ( start < len )
				{
					// find the substring length
					// int stringLen = std::min<int>( len - start, allowedLen );
					// doing it this way to support a VisualC++ 2005 bug 
					using namespace std; 
					int stringLen = min<int>( len - start, allowedLen );

					// trim the length so it doesn't end in middle of a word
					if ( stringLen == allowedLen )
						while ( stringLen >= 0 &&
								s[stringLen+start] != ' ' && 
								s[stringLen+start] != ',' &&
								s[stringLen+start] != '|' ) 
							stringLen--;
	
					// ok, the word is longer than the line, so just split 
					// wherever the line ends
					if ( stringLen <= 0 )
						stringLen = allowedLen;

					// check for newlines
					for ( int i = 0; i < stringLen; i++ )
						if ( s[start+i] == '\n' )
							stringLen = i+1;

					// print the indent	
					for ( int i = 0; i < indentSpaces; i++ )
						os << " ";

					if ( start == 0 )
						{
							// handle second line offsets
							indentSpaces += secondLineOffset;

							// adjust allowed len
							allowedLen -= secondLineOffset;
						}

					os << s.substr(start,stringLen) << std::endl;

					// so we don't start a line with a space
					while ( s[stringLen+start] == ' ' && start < len )
						start++;
			
					start += stringLen;
				}
		}
	else
		{
			for ( int i = 0; i < indentSpaces; i++ )
				os << " ";
			os << s << std::endl;
		}
}